

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O2

shared_ptr<gui::DialogBoxStyle> __thiscall gui::DialogBox::getStyle(DialogBox *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<gui::DialogBoxStyle> sVar1;
  
  if (*(char *)(in_RSI + 0x210) == '\0') {
    std::make_shared<gui::DialogBoxStyle,gui::DialogBoxStyle_const&>
              ((DialogBoxStyle *)&stack0xffffffffffffffd0);
    std::__shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x200),
               (__shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffd0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
    *(undefined1 *)(in_RSI + 0x210) = 1;
  }
  std::__shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x200));
  sVar1.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::DialogBoxStyle>)
         sVar1.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DialogBoxStyle> DialogBox::getStyle() {
    if (!styleCopied_) {
        style_ = style_->clone();
        styleCopied_ = true;
    }
    return style_;
}